

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

string * anon_unknown.dwarf_868a::readFileContents(string *__return_storage_ptr__,string *path)

{
  FILE *__stream;
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    for (uVar3 = 0; uVar3 <= uVar1 && uVar1 - uVar3 != 0; uVar3 = uVar3 + sVar2) {
      sVar2 = fread((__return_storage_ptr__->_M_dataplus)._M_p + uVar3,1,uVar1 - uVar3,__stream);
    }
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string readFileContents(std::string path) {
  FILE * fp = fopen(path.c_str(), "rb");
  std::string str;
  if (fp) {
    fseek(fp, 0, SEEK_END);
    uint64_t size = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    str.resize(size);
    size_t pos = 0;
    while (pos < size) {
      size_t result = fread((void *)(str.data() + pos), 1, size - pos, fp);
      pos += result;
    }
    fclose(fp);
  }
  return str;
}